

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.hpp
# Opt level: O2

void apply_filter(vector<cv::Mat,_std::allocator<cv::Mat>_> *image_list,arguments *args,char **argv,
                 int argc)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)color::blue_abi_cxx11_);
  poVar1 = std::operator<<(poVar1,"Optimizing Parameters :");
  poVar1 = std::operator<<(poVar1,(string *)color::reset_abi_cxx11_);
  std::endl<char,std::char_traits<char>>(poVar1);
  apply_brightness(image_list,args->brightness_value);
  apply_contrast(image_list,args->contrast_value);
  apply_saturation(image_list,args->saturation_value);
  apply_sharpen(image_list,args->sharpness_value);
  apply_blur(image_list,args->blur_value);
  return;
}

Assistant:

void apply_filter(std::vector<cv::Mat> &image_list, arguments args, char *argv[], int argc) {
   std::cout << color::blue << "Optimizing Parameters :" << color::reset << std::endl;
   
   apply_brightness(image_list, args.brightness_value);
   apply_contrast(image_list, args.contrast_value);
   apply_saturation(image_list, args.saturation_value);
   apply_sharpen(image_list, args.sharpness_value);
   apply_blur(image_list, args.blur_value);
}